

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddLinkExtension(cmComputeLinkInformation *this,char *e,LinkType type)

{
  long lVar1;
  char *local_10;
  
  if (e == (char *)0x0) {
    return;
  }
  if (*e == '\0') {
    return;
  }
  local_10 = e;
  if (type == LinkStatic) {
    lVar1 = 0x240;
  }
  else {
    if (type != LinkShared) goto LAB_0026d0ea;
    lVar1 = 600;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             ((long)&(this->Items).
                     super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar1),&local_10);
LAB_0026d0ea:
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->LinkExtensions,&local_10);
  return;
}

Assistant:

void cmComputeLinkInformation::AddLinkExtension(const char* e, LinkType type)
{
  if (e && *e) {
    if (type == LinkStatic) {
      this->StaticLinkExtensions.emplace_back(e);
    }
    if (type == LinkShared) {
      this->SharedLinkExtensions.emplace_back(e);
    }
    this->LinkExtensions.emplace_back(e);
  }
}